

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O2

LClosure * luaU_undump(lua_State *L,ZIO *Z,char *name)

{
  char cVar1;
  StkId pTVar2;
  lu_byte lVar3;
  byte bVar4;
  lua_Integer lVar5;
  LClosure *pLVar6;
  Proto *f;
  char *pcVar7;
  lua_Number lVar8;
  LoadState local_40;
  
  cVar1 = *name;
  if (cVar1 == '\x1b') {
    name = "binary string";
  }
  else if ((cVar1 == '@') || (cVar1 == '=')) {
    name = name + 1;
  }
  local_40.L = L;
  local_40.Z = Z;
  local_40.name = name;
  checkliteral(&local_40,"Ravi","not a");
  lVar3 = LoadByte(&local_40);
  if (lVar3 == 'S') {
    local_40.version = LoadByte(&local_40);
    if (local_40.version < 2) {
      checkliteral(&local_40,anon_var_dwarf_1647e,"corrupted");
      fchecksize(&local_40,4,"int");
      fchecksize(&local_40,8,"size_t");
      fchecksize(&local_40,4,"Instruction");
      fchecksize(&local_40,8,"lua_Integer");
      fchecksize(&local_40,8,"lua_Number");
      lVar5 = LoadInteger(&local_40);
      if (lVar5 == 0x5678) {
        lVar8 = LoadNumber(&local_40);
        if ((lVar8 == 370.5) && (!NAN(lVar8))) {
          bVar4 = LoadByte(&local_40);
          pLVar6 = luaF_newLclosure(L,(uint)bVar4);
          if ((pLVar6->tt & 0xe) < 10) {
            pTVar2 = L->top;
            (pTVar2->value_).gc = (GCObject *)pLVar6;
            pTVar2->tt_ = 0x8006;
            if ((pLVar6->tt == '\x06') && ((pLVar6->marked & (L->l_G->currentwhite ^ 0x18)) == 0)) {
              luaD_inctop(L);
              f = luaF_newproto(L);
              pLVar6->p = f;
              LoadFunction(&local_40,f,(TString *)0x0);
              if (pLVar6->p->sizeupvalues == (uint)pLVar6->nupvalues) {
                return pLVar6;
              }
              __assert_fail("cl->nupvalues == cl->p->sizeupvalues",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lundump.c"
                            ,0x134,"LClosure *luaU_undump(lua_State *, ZIO *, const char *)");
            }
            pcVar7 = "0";
          }
          else {
            pcVar7 = "(((x_)->tt) & 0x0F) < (9+1)";
          }
          __assert_fail(pcVar7,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lundump.c"
                        ,0x130,"LClosure *luaU_undump(lua_State *, ZIO *, const char *)");
        }
        pcVar7 = "float format mismatch in";
      }
      else {
        pcVar7 = "endianness mismatch in";
      }
    }
    else {
      pcVar7 = "format mismatch in";
    }
  }
  else {
    pcVar7 = "version mismatch in";
  }
  error(&local_40,pcVar7);
}

Assistant:

LClosure *luaU_undump(lua_State *L, ZIO *Z, const char *name) {
  LoadState S;
  LClosure *cl;
  if (*name == '@' || *name == '=')
    S.name = name + 1;
  else if (*name == LUA_SIGNATURE[0])
    S.name = "binary string";
  else
    S.name = name;
  S.L = L;
  S.Z = Z;
  checkHeader(&S);
  cl = luaF_newLclosure(L, LoadByte(&S));
  setclLvalue(L, L->top, cl);
  luaD_inctop(L);
  cl->p = luaF_newproto(L);
  LoadFunction(&S, cl->p, NULL);
  lua_assert(cl->nupvalues == cl->p->sizeupvalues);
  luai_verifycode(L, buff, cl->p);
  return cl;
}